

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadBlif.c
# Opt level: O1

Abc_Ntk_t * Io_ReadBlifNetworkOne(Io_ReadBlif_t *p)

{
  char cVar1;
  byte bVar2;
  void **ppvVar3;
  Vec_Str_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  double dVar6;
  double dVar7;
  Abc_Obj_t *pAVar8;
  bool bVar9;
  FILE *pFile;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  Abc_Ntk_t *pAVar14;
  char *pcVar15;
  Vec_Ptr_t *pVVar16;
  Mio_Library_t *pLib;
  Mio_Gate_t *pMVar17;
  Mio_Gate_t *pMVar18;
  size_t sVar19;
  ulong uVar20;
  Abc_Obj_t *pAVar21;
  long lVar22;
  void *pvVar23;
  void *pvVar24;
  long lVar25;
  char *pcVar26;
  Vec_Int_t *p_00;
  size_t __size;
  char *pcVar27;
  char **pNamesIn;
  ulong uVar28;
  char *pFoo1;
  char *local_60;
  char *local_58;
  Abc_Obj_t *local_50;
  ProgressBar *local_48;
  Abc_Ntk_t *local_40;
  Abc_Ntk_t *local_38;
  
  if (p->vTokens == (Vec_Ptr_t *)0x0) {
    __assert_fail("p->vTokens != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                  ,0xf2,"Abc_Ntk_t *Io_ReadBlifNetworkOne(Io_ReadBlif_t *)");
  }
  pAVar14 = Abc_NtkAlloc(ABC_NTK_NETLIST,ABC_FUNC_SOP,1);
  p->pNtkCur = pAVar14;
  pVVar16 = p->vTokens;
  ppvVar3 = pVVar16->pArray;
  pcVar15 = (char *)*ppvVar3;
  iVar10 = strcmp(pcVar15,".model");
  if (iVar10 == 0) {
    iVar10 = pVVar16->nSize;
    if (iVar10 == 2) {
      pcVar15 = (char *)ppvVar3[1];
      pcVar26 = pcVar15;
      do {
        do {
          pcVar27 = pcVar15;
          pcVar15 = pcVar26 + 1;
          cVar1 = *pcVar26;
          pcVar26 = pcVar15;
        } while (cVar1 == '/');
      } while ((cVar1 == '\\') || (pcVar15 = pcVar27, cVar1 != '\0'));
      pcVar15 = Extra_UtilStrsav(pcVar27);
      pAVar14->pName = pcVar15;
    }
    else {
      iVar12 = Extra_FileReaderGetLineNumber(p->pReader,0);
      p->LineCur = iVar12;
      builtin_strncpy(p->sError,"The .model line does not have exactly two entries.",0x33);
      Io_ReadBlifPrintErrorMessage(p);
    }
    if (iVar10 != 2) {
      return (Abc_Ntk_t *)0x0;
    }
  }
  else {
    iVar10 = strcmp(pcVar15,".exdc");
    if (iVar10 != 0) {
      pcVar15 = p->pFileName;
      uVar11 = Extra_FileReaderGetLineNumber(p->pReader,0);
      printf("%s: File parsing skipped after line %d (\"%s\").\n",pcVar15,(ulong)uVar11,
             *p->vTokens->pArray);
      Abc_NtkDelete(pAVar14);
      p->pNtkCur = (Abc_Ntk_t *)0x0;
      return (Abc_Ntk_t *)0x0;
    }
  }
  pFile = _stdout;
  local_40 = pAVar14;
  if (p->pNtkMaster == (Abc_Ntk_t *)0x0) {
    iVar10 = Extra_FileReaderGetFileSize(p->pReader);
    local_48 = Extra_ProgressBarStart(pFile,iVar10);
  }
  else {
    local_48 = (ProgressBar *)0x0;
  }
  pcVar15 = p->sError;
  uVar28 = 0;
  bVar9 = false;
  iVar10 = 0;
  do {
    if (!bVar9) {
      pVVar16 = Io_ReadBlifGetTokens(p);
      p->vTokens = pVVar16;
      if (pVVar16 == (Vec_Ptr_t *)0x0) goto LAB_0032dbc7;
    }
    if (((p->pNtkMaster == (Abc_Ntk_t *)0x0) && ((int)uVar28 == (int)(uVar28 / 1000) * 1000)) &&
       ((iVar12 = Extra_FileReaderGetCurPosition(p->pReader), local_48 == (ProgressBar *)0x0 ||
        (local_48->nItemsNext <= iVar12)))) {
      Extra_ProgressBarUpdate_int(local_48,iVar12,(char *)0x0);
    }
    pVVar16 = p->vTokens;
    ppvVar3 = pVVar16->pArray;
    pcVar26 = (char *)*ppvVar3;
    iVar12 = strcmp(pcVar26,".names");
    if (iVar12 == 0) {
      if (pVVar16->nSize < 2) {
        iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
        p->LineCur = iVar10;
        builtin_strncpy(pcVar15,"The .names line has less than two tokens.",0x2a);
LAB_0032c79e:
        Io_ReadBlifPrintErrorMessage(p);
        bVar9 = true;
LAB_0032d078:
        iVar10 = 1;
      }
      else {
        local_38 = p->pNtkCur;
        uVar11 = pVVar16->nSize - 2;
        local_50 = Io_ReadCreateNode(local_38,(char *)ppvVar3[(ulong)uVar11 + 1],
                                     (char **)(ppvVar3 + 1),uVar11);
        p->vCubes->nSize = 0;
        iVar10 = pVVar16->nSize;
        pVVar16 = Io_ReadBlifGetTokens(p);
        if (iVar10 == 2) {
          while (pVVar16 != (Vec_Ptr_t *)0x0) {
            cVar1 = **pVVar16->pArray;
            if (cVar1 == '.') goto LAB_0032cce1;
            if (pVVar16->nSize != 1) {
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              builtin_strncpy(pcVar15,"The number of tokens in the cons",0x20);
LAB_0032d165:
              builtin_strncpy(p->sError + 0x20,"tant cube is wrong.",0x14);
              goto LAB_0032d955;
            }
            pVVar4 = p->vCubes;
            uVar11 = pVVar4->nCap;
            if (pVVar4->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(0x10);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
                }
                pVVar4->pArray = pcVar26;
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar11 * 2;
                if ((int)sVar19 <= (int)uVar11) goto LAB_0032c8eb;
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(sVar19);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
                }
                pVVar4->pArray = pcVar26;
              }
              pVVar4->nCap = (int)sVar19;
            }
LAB_0032c8eb:
            iVar10 = pVVar4->nSize;
            pVVar4->nSize = iVar10 + 1;
            pVVar4->pArray[iVar10] = ' ';
            pVVar4 = p->vCubes;
            uVar11 = pVVar4->nCap;
            if (pVVar4->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(0x10);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
                }
                pVVar4->pArray = pcVar26;
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar11 * 2;
                if ((int)sVar19 <= (int)uVar11) goto LAB_0032c965;
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(sVar19);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
                }
                pVVar4->pArray = pcVar26;
              }
              pVVar4->nCap = (int)sVar19;
            }
LAB_0032c965:
            iVar10 = pVVar4->nSize;
            pVVar4->nSize = iVar10 + 1;
            pVVar4->pArray[iVar10] = cVar1;
            pVVar4 = p->vCubes;
            uVar11 = pVVar4->nCap;
            if (pVVar4->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(0x10);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
                }
                pVVar4->pArray = pcVar26;
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar11 * 2;
                if ((int)sVar19 <= (int)uVar11) goto LAB_0032c9df;
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(sVar19);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
                }
                pVVar4->pArray = pcVar26;
              }
              pVVar4->nCap = (int)sVar19;
            }
LAB_0032c9df:
            iVar10 = pVVar4->nSize;
            pVVar4->nSize = iVar10 + 1;
            pVVar4->pArray[iVar10] = '\n';
            pVVar16 = Io_ReadBlifGetTokens(p);
          }
        }
        else {
          while (pVVar16 != (Vec_Ptr_t *)0x0) {
            pcVar26 = (char *)*pVVar16->pArray;
            if (*pcVar26 == '.') goto LAB_0032cce1;
            if (pVVar16->nSize != 2) {
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              builtin_strncpy(pcVar15,"The number of tokens in the cube is wrong.",0x2b);
              goto LAB_0032c79e;
            }
            pVVar4 = p->vCubes;
            sVar19 = strlen(pcVar26);
            if (0 < (int)(uint)sVar19) {
              uVar20 = 0;
              do {
                cVar1 = pcVar26[uVar20];
                uVar11 = pVVar4->nCap;
                if (pVVar4->nSize == uVar11) {
                  if ((int)uVar11 < 0x10) {
                    if (pVVar4->pArray == (char *)0x0) {
                      pcVar27 = (char *)malloc(0x10);
                    }
                    else {
                      pcVar27 = (char *)realloc(pVVar4->pArray,0x10);
                    }
                    __size = 0x10;
                  }
                  else {
                    __size = (ulong)uVar11 * 2;
                    if ((int)__size <= (int)uVar11) goto LAB_0032cb03;
                    if (pVVar4->pArray == (char *)0x0) {
                      pcVar27 = (char *)malloc(__size);
                    }
                    else {
                      pcVar27 = (char *)realloc(pVVar4->pArray,__size);
                    }
                  }
                  pVVar4->pArray = pcVar27;
                  pVVar4->nCap = (int)__size;
                }
LAB_0032cb03:
                iVar10 = pVVar4->nSize;
                pVVar4->nSize = iVar10 + 1;
                pVVar4->pArray[iVar10] = cVar1;
                uVar20 = uVar20 + 1;
              } while (((uint)sVar19 & 0x7fffffff) != uVar20);
            }
            bVar2 = *pVVar16->pArray[1];
            if (((1 < bVar2 - 0x30) && (bVar2 != 0x6e)) && (bVar2 != 0x78)) {
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              builtin_strncpy(pcVar15,"The output character in the cons",0x20);
              goto LAB_0032d165;
            }
            pVVar4 = p->vCubes;
            uVar11 = pVVar4->nCap;
            if (pVVar4->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(0x10);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
                }
                pVVar4->pArray = pcVar26;
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar11 * 2;
                if ((int)sVar19 <= (int)uVar11) goto LAB_0032cbbe;
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(sVar19);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
                }
                pVVar4->pArray = pcVar26;
              }
              pVVar4->nCap = (int)sVar19;
            }
LAB_0032cbbe:
            iVar10 = pVVar4->nSize;
            pVVar4->nSize = iVar10 + 1;
            pVVar4->pArray[iVar10] = ' ';
            pVVar4 = p->vCubes;
            uVar11 = pVVar4->nCap;
            if (pVVar4->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(0x10);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
                }
                pVVar4->pArray = pcVar26;
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar11 * 2;
                if ((int)sVar19 <= (int)uVar11) goto LAB_0032cc38;
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(sVar19);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
                }
                pVVar4->pArray = pcVar26;
              }
              pVVar4->nCap = (int)sVar19;
            }
LAB_0032cc38:
            iVar10 = pVVar4->nSize;
            pVVar4->nSize = iVar10 + 1;
            pVVar4->pArray[iVar10] = bVar2;
            pVVar4 = p->vCubes;
            uVar11 = pVVar4->nCap;
            if (pVVar4->nSize == uVar11) {
              if ((int)uVar11 < 0x10) {
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(0x10);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
                }
                pVVar4->pArray = pcVar26;
                sVar19 = 0x10;
              }
              else {
                sVar19 = (ulong)uVar11 * 2;
                if ((int)sVar19 <= (int)uVar11) goto LAB_0032ccb2;
                if (pVVar4->pArray == (char *)0x0) {
                  pcVar26 = (char *)malloc(sVar19);
                }
                else {
                  pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
                }
                pVVar4->pArray = pcVar26;
              }
              pVVar4->nCap = (int)sVar19;
            }
LAB_0032ccb2:
            iVar10 = pVVar4->nSize;
            pVVar4->nSize = iVar10 + 1;
            pVVar4->pArray[iVar10] = '\n';
            pVVar16 = Io_ReadBlifGetTokens(p);
          }
        }
        pVVar16 = (Vec_Ptr_t *)0x0;
LAB_0032cce1:
        pVVar4 = p->vCubes;
        if (pVVar4->nSize == 0) {
          if (pVVar4->nCap == 0) {
            if (pVVar4->pArray == (char *)0x0) {
              pcVar26 = (char *)malloc(0x10);
            }
            else {
              pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
            }
            pVVar4->pArray = pcVar26;
            pVVar4->nCap = 0x10;
          }
          iVar10 = pVVar4->nSize;
          pVVar4->nSize = iVar10 + 1;
          pVVar4->pArray[iVar10] = ' ';
          pVVar4 = p->vCubes;
          uVar11 = pVVar4->nCap;
          if (pVVar4->nSize == uVar11) {
            if ((int)uVar11 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar26 = (char *)malloc(0x10);
              }
              else {
                pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar26;
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar11 * 2;
              if ((int)sVar19 <= (int)uVar11) goto LAB_0032d7b3;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar26 = (char *)malloc(sVar19);
              }
              else {
                pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
              }
              pVVar4->pArray = pcVar26;
            }
            pVVar4->nCap = (int)sVar19;
          }
LAB_0032d7b3:
          iVar10 = pVVar4->nSize;
          pVVar4->nSize = iVar10 + 1;
          pVVar4->pArray[iVar10] = '0';
          pVVar4 = p->vCubes;
          uVar11 = pVVar4->nCap;
          if (pVVar4->nSize == uVar11) {
            if ((int)uVar11 < 0x10) {
              if (pVVar4->pArray == (char *)0x0) {
                pcVar26 = (char *)malloc(0x10);
              }
              else {
                pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
              }
              pVVar4->pArray = pcVar26;
              sVar19 = 0x10;
            }
            else {
              sVar19 = (ulong)uVar11 * 2;
              if ((int)sVar19 <= (int)uVar11) goto LAB_0032d830;
              if (pVVar4->pArray == (char *)0x0) {
                pcVar26 = (char *)malloc(sVar19);
              }
              else {
                pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
              }
              pVVar4->pArray = pcVar26;
            }
            pVVar4->nCap = (int)sVar19;
          }
LAB_0032d830:
          iVar10 = pVVar4->nSize;
          pVVar4->nSize = iVar10 + 1;
          pVVar4->pArray[iVar10] = '\n';
        }
        pVVar4 = p->vCubes;
        uVar11 = pVVar4->nCap;
        if (pVVar4->nSize == uVar11) {
          if ((int)uVar11 < 0x10) {
            if (pVVar4->pArray == (char *)0x0) {
              pcVar26 = (char *)malloc(0x10);
            }
            else {
              pcVar26 = (char *)realloc(pVVar4->pArray,0x10);
            }
            pVVar4->pArray = pcVar26;
            sVar19 = 0x10;
          }
          else {
            sVar19 = (ulong)uVar11 * 2;
            if ((int)sVar19 <= (int)uVar11) goto LAB_0032d8ad;
            if (pVVar4->pArray == (char *)0x0) {
              pcVar26 = (char *)malloc(sVar19);
            }
            else {
              pcVar26 = (char *)realloc(pVVar4->pArray,sVar19);
            }
            pVVar4->pArray = pcVar26;
          }
          pVVar4->nCap = (int)sVar19;
        }
LAB_0032d8ad:
        iVar10 = pVVar4->nSize;
        pVVar4->nSize = iVar10 + 1;
        pVVar4->pArray[iVar10] = '\0';
        pcVar26 = Abc_SopRegister((Mem_Flex_t *)local_38->pManFunc,p->vCubes->pArray);
        pAVar21 = local_50;
        (local_50->field_5).pData = pcVar26;
        iVar10 = (local_50->vFanins).nSize;
        iVar12 = Abc_SopGetVarNum(pcVar26);
        if (iVar10 == iVar12) {
          p->vTokens = pVVar16;
          iVar10 = 0;
          bVar9 = true;
        }
        else {
          iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar10;
          uVar11 = (pAVar21->vFanins).nSize;
          pcVar26 = Abc_ObjName((Abc_Obj_t *)
                                pAVar21->pNtk->vObjs->pArray[*(pAVar21->vFanouts).pArray]);
          uVar13 = Abc_SopGetVarNum((char *)(pAVar21->field_5).pData);
          sprintf(pcVar15,"The number of fanins (%d) of node %s is different from SOP size (%d).",
                  (ulong)uVar11,pcVar26,(ulong)uVar13);
LAB_0032d955:
          Io_ReadBlifPrintErrorMessage(p);
          bVar9 = true;
LAB_0032d963:
          iVar10 = 1;
        }
      }
    }
    else {
      iVar12 = strcmp(pcVar26,".gate");
      if (iVar12 == 0) {
        pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
        if (pLib == (Mio_Library_t *)0x0) {
          iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar10;
          builtin_strncpy(pcVar15,"The current library is not available.",0x26);
        }
        else if (pVVar16->nSize < 2) {
          iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar10;
          builtin_strncpy(pcVar15,"The .gate line has less than two tokens.",0x29);
        }
        else {
          pMVar17 = Mio_LibraryReadGateByName(pLib,(char *)pVVar16->pArray[1],(char *)0x0);
          if (pMVar17 != (Mio_Gate_t *)0x0) {
            pAVar14 = p->pNtkCur;
            if (pAVar14->nObjCounts[7] == 0) {
              if (pAVar14->ntkFunc != ABC_FUNC_SOP) {
                __assert_fail("p->pNtkCur->ntkFunc == ABC_FUNC_SOP",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x2cd,"int Io_ReadBlifNetworkGate(Io_ReadBlif_t *, Vec_Ptr_t *)");
              }
              pAVar14->ntkFunc = ABC_FUNC_MAP;
              Mem_FlexStop((Mem_Flex_t *)pAVar14->pManFunc,0);
              p->pNtkCur->pManFunc = pLib;
            }
            pMVar18 = Mio_GateReadTwin(pMVar17);
            iVar10 = Io_ReadBlifReorderFormalNames(pVVar16,pMVar17,pMVar18);
            if (iVar10 != 0) {
              iVar10 = pVVar16->nSize;
              if (2 < (long)iVar10) {
                lVar22 = 2;
                do {
                  ppvVar3 = pVVar16->pArray;
                  pcVar26 = (char *)ppvVar3[lVar22];
                  sVar19 = strlen(pcVar26);
                  if (0 < (int)(uint)sVar19) {
                    uVar20 = (ulong)((uint)sVar19 & 0x7fffffff);
                    do {
                      pcVar27 = pcVar26 + 1;
                      if (*pcVar26 == '=') goto LAB_0032ce5c;
                      uVar20 = uVar20 - 1;
                      pcVar26 = pcVar27;
                    } while (uVar20 != 0);
                  }
                  pcVar27 = (char *)0x0;
LAB_0032ce5c:
                  ppvVar3[lVar22] = pcVar27;
                  if (pVVar16->pArray[lVar22] == (void *)0x0) {
                    iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                    p->LineCur = iVar10;
                    builtin_strncpy(pcVar15,"Invalid gate input assignment.",0x1f);
                    goto LAB_0032d447;
                  }
                  lVar22 = lVar22 + 1;
                } while (lVar22 != iVar10);
              }
              pMVar18 = Mio_GateReadTwin(pMVar17);
              ppvVar3 = pVVar16->pArray;
              pNamesIn = (char **)(ppvVar3 + 2);
              iVar10 = pVVar16->nSize;
              if (pMVar18 == (Mio_Gate_t *)0x0) {
                pAVar21 = Io_ReadCreateNode(p->pNtkCur,(char *)ppvVar3[(long)iVar10 + -1],pNamesIn,
                                            iVar10 + -3);
                (pAVar21->field_5).pData = pMVar17;
              }
              else {
                if ((char *)ppvVar3[(long)iVar10 + -2] == (char *)0x0) {
                  if (ppvVar3[(long)iVar10 + -1] == (void *)0x0) {
                    __assert_fail("ppNames[nNames] != NULL || ppNames[nNames+1] != NULL",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                                  ,0x2f6,"int Io_ReadBlifNetworkGate(Io_ReadBlif_t *, Vec_Ptr_t *)")
                    ;
                  }
                }
                else {
                  pAVar21 = Io_ReadCreateNode(p->pNtkCur,(char *)ppvVar3[(long)iVar10 + -2],pNamesIn
                                              ,iVar10 + -4);
                  (pAVar21->field_5).pData = pMVar17;
                }
                if ((char *)ppvVar3[(long)iVar10 + -1] == (char *)0x0) goto LAB_0032d5d6;
                pAVar21 = Io_ReadCreateNode(p->pNtkCur,(char *)ppvVar3[(long)iVar10 + -1],pNamesIn,
                                            iVar10 + -4);
                pMVar17 = Mio_GateReadTwin(pMVar17);
                (pAVar21->field_5).pData = pMVar17;
              }
              goto LAB_0032cf05;
            }
            iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar10;
            sprintf(pcVar15,"Mismatch in the fanins of gate \"%s\".",pVVar16->pArray[1]);
LAB_0032d447:
            bVar9 = false;
            Io_ReadBlifPrintErrorMessage(p);
            goto LAB_0032d963;
          }
          iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar10;
          pvVar24 = pVVar16->pArray[1];
          pcVar26 = "Cannot find gate \"%s\" in the library.";
LAB_0032d069:
          sprintf(pcVar15,pcVar26,pvVar24);
        }
LAB_0032d070:
        bVar9 = false;
        Io_ReadBlifPrintErrorMessage(p);
        goto LAB_0032d078;
      }
      iVar12 = strcmp(pcVar26,".latch");
      if (iVar12 == 0) {
        if (pVVar16->nSize < 3) {
          iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
          p->LineCur = iVar10;
          builtin_strncpy(pcVar15,"The .latch line does not have enough tokens.",0x2d);
          goto LAB_0032d070;
        }
        pAVar21 = Io_ReadCreateLatch(p->pNtkCur,(char *)ppvVar3[1],(char *)ppvVar3[2]);
        if ((long)pVVar16->nSize == 3) {
          if ((*(uint *)&pAVar21->field_0x14 & 0xf) != 8) {
LAB_0032dc10:
            __assert_fail("Abc_ObjIsLatch(pLatch)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                          ,0x1a6,"void Abc_LatchSetInitDc(Abc_Obj_t *)");
          }
          pAVar21->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
        }
        else {
          uVar11 = atoi((char *)pVVar16->pArray[(long)pVVar16->nSize + -1]);
          if (2 < uVar11) {
            iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
            p->LineCur = iVar10;
            pvVar24 = pVVar16->pArray[3];
            pcVar26 = "The .latch line has an unknown reset value (%s).";
            goto LAB_0032d069;
          }
          if (uVar11 == 2) {
            if ((*(uint *)&pAVar21->field_0x14 & 0xf) != 8) goto LAB_0032dc10;
            pAVar21->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x3;
          }
          else if (uVar11 == 1) {
            if ((*(uint *)&pAVar21->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a5,"void Abc_LatchSetInit1(Abc_Obj_t *)");
            }
            pAVar21->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x2;
          }
          else if (uVar11 == 0) {
            if ((*(uint *)&pAVar21->field_0x14 & 0xf) != 8) {
              __assert_fail("Abc_ObjIsLatch(pLatch)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                            ,0x1a4,"void Abc_LatchSetInit0(Abc_Obj_t *)");
            }
            pAVar21->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0x1;
          }
        }
LAB_0032cf05:
        bVar9 = false;
        iVar10 = 0;
        goto LAB_0032d96d;
      }
      iVar12 = strcmp(pcVar26,".inputs");
      if (iVar12 == 0) {
        if (pVVar16->nSize < 2) goto LAB_0032cf05;
        lVar22 = 1;
        do {
          Io_ReadCreatePi(p->pNtkCur,(char *)pVVar16->pArray[lVar22]);
          lVar22 = lVar22 + 1;
        } while (lVar22 < pVVar16->nSize);
      }
      else {
        iVar12 = strcmp(pcVar26,".outputs");
        if (iVar12 != 0) {
          iVar12 = strcmp(pcVar26,".input_arrival");
          if (iVar12 == 0) {
            iVar10 = strncmp(pcVar26,".input_arrival",0xe);
            if (iVar10 != 0) {
              __assert_fail("strncmp( (char *)vTokens->pArray[0], \".input_arrival\", 14 ) == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                            ,0x356,
                            "int Io_ReadBlifNetworkInputArrival(Io_ReadBlif_t *, Vec_Ptr_t *)");
            }
            if (pVVar16->nSize == 4) {
              pAVar21 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar3[1]);
              if (pAVar21 != (Abc_Obj_t *)0x0) {
                dVar7 = strtod((char *)pVVar16->pArray[2],&local_58);
                pAVar8 = (Abc_Obj_t *)strtod((char *)pVVar16->pArray[3],&local_60);
                if ((*local_58 == '\0') && (*local_60 == '\0')) {
                  local_50 = pAVar8;
                  Vec_IntPush(p->vInArrs,
                              *(int *)((long)pAVar21->pNtk->vObjs->pArray
                                             [*(pAVar21->vFanins).pArray] + 0x10));
                  Vec_IntPush(p->vInArrs,(int)(float)dVar7);
                  p_00 = p->vInArrs;
LAB_0032da61:
                  Vec_IntPush(p_00,(int)(float)(double)local_50);
                  goto LAB_0032dad0;
                }
                iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar10;
                pvVar24 = pVVar16->pArray[2];
                pvVar23 = pVVar16->pArray[3];
                pcVar26 = "Bad value (%s %s) for rise or fall time on .input_arrival line.";
                goto LAB_0032d56e;
              }
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              pvVar24 = pVVar16->pArray[1];
              pcVar26 = "Cannot find object corresponding to %s on .input_arrival line.";
LAB_0032d6ba:
              sprintf(pcVar15,pcVar26,pvVar24);
            }
            else {
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              builtin_strncpy(pcVar15,"Wrong number of arguments on .input_arrival line.",0x32);
            }
LAB_0032d6c1:
            Io_ReadBlifPrintErrorMessage(p);
            iVar10 = 1;
          }
          else {
            iVar12 = strcmp(pcVar26,".output_required");
            if (iVar12 == 0) {
              iVar10 = strncmp(pcVar26,".output_required",0x10);
              if (iVar10 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".output_required\", 16 ) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x389,
                              "int Io_ReadBlifNetworkOutputRequired(Io_ReadBlif_t *, Vec_Ptr_t *)");
              }
              if (pVVar16->nSize == 4) {
                pAVar21 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar3[1]);
                if (pAVar21 == (Abc_Obj_t *)0x0) {
                  iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar10;
                  pvVar24 = pVVar16->pArray[1];
                  pcVar26 = "Cannot find object corresponding to %s on .output_required line.";
                  goto LAB_0032d6ba;
                }
                dVar7 = strtod((char *)pVVar16->pArray[2],&local_58);
                pAVar8 = (Abc_Obj_t *)strtod((char *)pVVar16->pArray[3],&local_60);
                if ((*local_58 == '\0') && (*local_60 == '\0')) {
                  local_50 = pAVar8;
                  Vec_IntPush(p->vOutReqs,
                              *(int *)((long)pAVar21->pNtk->vObjs->pArray
                                             [*(pAVar21->vFanouts).pArray] + 0x10));
                  Vec_IntPush(p->vOutReqs,(int)(float)dVar7);
                  p_00 = p->vOutReqs;
                  goto LAB_0032da61;
                }
                iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar10;
                pvVar24 = pVVar16->pArray[2];
                pvVar23 = pVVar16->pArray[3];
                pcVar26 = "Bad value (%s %s) for rise or fall time on .output_required line.";
LAB_0032d56e:
                sprintf(pcVar15,pcVar26,pvVar24,pvVar23);
              }
              else {
                iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar10;
                builtin_strncpy(pcVar15,"Wrong number of arguments on .output_required line.",0x34);
              }
              goto LAB_0032d6c1;
            }
            iVar12 = strcmp(pcVar26,".default_input_arrival");
            if (iVar12 == 0) {
              iVar10 = strncmp(pcVar26,".default_input_arrival",0x17);
              if (iVar10 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_input_arrival\", 23 ) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x3bb,
                              "int Io_ReadBlifNetworkDefaultInputArrival(Io_ReadBlif_t *, Vec_Ptr_t *)"
                             );
              }
              if (pVVar16->nSize == 3) {
                dVar7 = strtod((char *)ppvVar3[1],&local_58);
                dVar6 = strtod((char *)pVVar16->pArray[2],&local_60);
                if ((*local_58 == '\0') && (*local_60 == '\0')) {
                  p->DefInArrRise = (float)dVar7;
                  p->DefInArrFall = (float)dVar6;
                  p->fHaveDefInArr = 1;
LAB_0032dad0:
                  iVar10 = 0;
                  goto LAB_0032d6ce;
                }
                iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar10;
                pvVar24 = pVVar16->pArray[1];
                pvVar23 = pVVar16->pArray[2];
                pcVar26 = "Bad value (%s %s) for rise or fall time on .default_input_arrival line.";
                goto LAB_0032d56e;
              }
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              builtin_strncpy(pcVar15,"Wrong number of arguments on .default_input_arrival line.",
                              0x3a);
              goto LAB_0032d6c1;
            }
            iVar12 = strcmp(pcVar26,".default_output_required");
            if (iVar12 == 0) {
              iVar10 = strncmp(pcVar26,".default_output_required",0x19);
              if (iVar10 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".default_output_required\", 25 ) == 0"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x3e5,
                              "int Io_ReadBlifNetworkDefaultOutputRequired(Io_ReadBlif_t *, Vec_Ptr_t *)"
                             );
              }
              if (pVVar16->nSize == 3) {
                dVar7 = strtod((char *)ppvVar3[1],&local_58);
                dVar6 = strtod((char *)pVVar16->pArray[2],&local_60);
                if ((*local_58 == '\0') && (*local_60 == '\0')) {
                  p->DefOutReqRise = (float)dVar7;
                  p->DefOutReqFall = (float)dVar6;
                  p->fHaveDefOutReq = 1;
                  goto LAB_0032dad0;
                }
                iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar10;
                pvVar24 = pVVar16->pArray[1];
                pvVar23 = pVVar16->pArray[2];
                pcVar26 = 
                "Bad value (%s %s) for rise or fall time on .default_output_required line.";
                goto LAB_0032d56e;
              }
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              builtin_strncpy(pcVar15,"Wrong number of arguments on .default_output_required line.",
                              0x3c);
              goto LAB_0032d6c1;
            }
            iVar12 = strcmp(pcVar26,".input_drive");
            if (iVar12 == 0) {
              iVar10 = strncmp(pcVar26,".input_drive",0xc);
              if (iVar10 != 0) {
                __assert_fail("strncmp( (char *)vTokens->pArray[0], \".input_drive\", 12 ) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioReadBlif.c"
                              ,0x41a,
                              "int Io_ReadBlifNetworkInputDrive(Io_ReadBlif_t *, Vec_Ptr_t *)");
              }
              if (pVVar16->nSize == 4) {
                pAVar21 = Abc_NtkFindNet(p->pNtkCur,(char *)ppvVar3[1]);
                if (pAVar21 == (Abc_Obj_t *)0x0) {
                  iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  p->LineCur = iVar10;
                  pvVar24 = pVVar16->pArray[1];
                  pcVar26 = "Cannot find object corresponding to %s on .input_drive line.";
                  goto LAB_0032d6ba;
                }
                dVar7 = strtod((char *)pVVar16->pArray[2],&local_58);
                pAVar8 = (Abc_Obj_t *)strtod((char *)pVVar16->pArray[3],&local_60);
                if ((*local_58 == '\0') && (*local_60 == '\0')) {
                  iVar10 = *(int *)((long)pAVar21->pNtk->vObjs->pArray[*(pAVar21->vFanins).pArray] +
                                   0x10);
                  if ((long)iVar10 < 0) {
LAB_0032dd46:
                    __assert_fail("i >= 0 && i < p->nSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
                  }
                  pVVar16 = p->pNtkCur->vObjs;
                  if (pVVar16->nSize <= iVar10) goto LAB_0032dd46;
                  pVVar5 = p->pNtkCur->vCis;
                  lVar22 = (long)pVVar5->nSize;
                  iVar12 = -1;
                  if (0 < lVar22) {
                    lVar25 = 0;
                    do {
                      if (pVVar5->pArray[lVar25] == pVVar16->pArray[iVar10]) {
                        iVar12 = (int)lVar25;
                        break;
                      }
                      lVar25 = lVar25 + 1;
                    } while (lVar22 != lVar25);
                  }
                  local_50 = pAVar8;
                  Vec_IntPush(p->vInDrives,iVar12);
                  Vec_IntPush(p->vInDrives,(int)(float)dVar7);
                  p_00 = p->vInDrives;
                  goto LAB_0032da61;
                }
                iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
                p->LineCur = iVar10;
                pvVar24 = pVVar16->pArray[2];
                pvVar23 = pVVar16->pArray[3];
                pcVar26 = "Bad value (%s %s) for rise or fall time on .input_drive line.";
                goto LAB_0032d56e;
              }
              iVar10 = Extra_FileReaderGetLineNumber(p->pReader,0);
              p->LineCur = iVar10;
              builtin_strncpy(pcVar15,"Wrong number of arguments on .input_drive line.",0x30);
              goto LAB_0032d6c1;
            }
            iVar12 = strcmp(pcVar26,".output_load");
            if (iVar12 == 0) {
              iVar10 = Io_ReadBlifNetworkOutputLoad(p,pVVar16);
              bVar9 = false;
              goto LAB_0032d96d;
            }
            iVar12 = strcmp(pcVar26,".default_input_drive");
            if (iVar12 == 0) {
              iVar10 = Io_ReadBlifNetworkDefaultInputDrive(p,pVVar16);
            }
            else {
              iVar12 = strcmp(pcVar26,".default_output_load");
              if (iVar12 == 0) {
                iVar10 = Io_ReadBlifNetworkDefaultOutputLoad(p,pVVar16);
              }
              else {
                iVar12 = strcmp(pcVar26,".and_gate_delay");
                if (iVar12 != 0) {
                  iVar12 = strcmp(pcVar26,".exdc");
                  if (iVar12 == 0) goto LAB_0032dbc7;
                  iVar12 = strcmp(pcVar26,".end");
                  if (iVar12 == 0) {
                    pVVar16 = Io_ReadBlifGetTokens(p);
                    p->vTokens = pVVar16;
                    goto LAB_0032dbc7;
                  }
                  iVar12 = strcmp(pcVar26,".blackbox");
                  pAVar14 = local_40;
                  if (iVar12 == 0) {
                    local_40->ntkType = ABC_NTK_NETLIST;
                    local_40->ntkFunc = ABC_FUNC_BLACKBOX;
                    Mem_FlexStop((Mem_Flex_t *)local_40->pManFunc,0);
                    pAVar14->pManFunc = (void *)0x0;
                    goto LAB_0032d5d8;
                  }
                  pcVar27 = p->pFileName;
                  bVar9 = false;
                  uVar11 = Extra_FileReaderGetLineNumber(p->pReader,0);
                  printf("%s (line %d): Skipping directive \"%s\".\n",pcVar27,(ulong)uVar11,pcVar26)
                  ;
                  goto LAB_0032d96d;
                }
                iVar10 = Io_ReadBlifNetworkAndGateDelay(p,pVVar16);
              }
            }
          }
LAB_0032d6ce:
          bVar9 = false;
          goto LAB_0032d96d;
        }
        if (pVVar16->nSize < 2) {
LAB_0032d5d6:
          iVar10 = 0;
LAB_0032d5d8:
          bVar9 = false;
          goto LAB_0032d96d;
        }
        lVar22 = 1;
        do {
          Io_ReadCreatePo(p->pNtkCur,(char *)pVVar16->pArray[lVar22]);
          lVar22 = lVar22 + 1;
        } while (lVar22 < pVVar16->nSize);
      }
      bVar9 = false;
      iVar10 = 0;
    }
LAB_0032d96d:
    if (p->vTokens == (Vec_Ptr_t *)0x0) {
LAB_0032dbc7:
      if (p->pNtkMaster == (Abc_Ntk_t *)0x0) {
        Extra_ProgressBarStop(local_48);
        return local_40;
      }
      return local_40;
    }
    uVar28 = (ulong)((int)uVar28 + 1);
    if (iVar10 == 1) {
      Extra_ProgressBarStop(local_48);
      Abc_NtkDelete(local_40);
      return (Abc_Ntk_t *)0x0;
    }
  } while( true );
}

Assistant:

Abc_Ntk_t * Io_ReadBlifNetworkOne( Io_ReadBlif_t * p )
{
    ProgressBar * pProgress = NULL;
    Abc_Ntk_t * pNtk;
    char * pDirective;
    int iLine, fTokensReady, fStatus;

    // make sure the tokens are present
    assert( p->vTokens != NULL );

    // create the new network
    p->pNtkCur = pNtk = Abc_NtkAlloc( ABC_NTK_NETLIST, ABC_FUNC_SOP, 1 );
    // read the model name
    if ( strcmp( (char *)p->vTokens->pArray[0], ".model" ) == 0 )
    {
        char * pToken, * pPivot;
        if ( Vec_PtrSize(p->vTokens) != 2 )
        {
            p->LineCur = Extra_FileReaderGetLineNumber(p->pReader, 0);
            sprintf( p->sError, "The .model line does not have exactly two entries." );
            Io_ReadBlifPrintErrorMessage( p );
            return NULL;
        }
        for ( pPivot = pToken = (char *)Vec_PtrEntry(p->vTokens, 1); *pToken; pToken++ )
            if ( *pToken == '/' || *pToken == '\\' )
                pPivot = pToken+1;
        pNtk->pName = Extra_UtilStrsav( pPivot );
    }
    else if ( strcmp( (char *)p->vTokens->pArray[0], ".exdc" ) != 0 ) 
    {
        printf( "%s: File parsing skipped after line %d (\"%s\").\n", p->pFileName, 
            Extra_FileReaderGetLineNumber(p->pReader, 0), (char*)p->vTokens->pArray[0] );
        Abc_NtkDelete(pNtk);
        p->pNtkCur = NULL;
        return NULL;
    }

    // read the inputs/outputs
    if ( p->pNtkMaster == NULL )
        pProgress = Extra_ProgressBarStart( stdout, Extra_FileReaderGetFileSize(p->pReader) );
    fTokensReady = fStatus = 0;
    for ( iLine = 0; fTokensReady || (p->vTokens = Io_ReadBlifGetTokens(p)); iLine++ )
    {
        if ( p->pNtkMaster == NULL && iLine % 1000 == 0 )
            Extra_ProgressBarUpdate( pProgress, Extra_FileReaderGetCurPosition(p->pReader), NULL );

        // consider different line types
        fTokensReady = 0;
        pDirective = (char *)p->vTokens->pArray[0];
        if ( !strcmp( pDirective, ".names" ) )
            { fStatus = Io_ReadBlifNetworkNames( p, &p->vTokens ); fTokensReady = 1; }
        else if ( !strcmp( pDirective, ".gate" ) )
            fStatus = Io_ReadBlifNetworkGate( p, p->vTokens );
        else if ( !strcmp( pDirective, ".latch" ) )
            fStatus = Io_ReadBlifNetworkLatch( p, p->vTokens );
        else if ( !strcmp( pDirective, ".inputs" ) )
            fStatus = Io_ReadBlifNetworkInputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".outputs" ) )
            fStatus = Io_ReadBlifNetworkOutputs( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_arrival" ) )
            fStatus = Io_ReadBlifNetworkInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_required" ) )
            fStatus = Io_ReadBlifNetworkOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_arrival" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputArrival( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_required" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputRequired( p, p->vTokens );
        else if ( !strcmp( pDirective, ".input_drive" ) )
            fStatus = Io_ReadBlifNetworkInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".output_load" ) )
            fStatus = Io_ReadBlifNetworkOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_input_drive" ) )
            fStatus = Io_ReadBlifNetworkDefaultInputDrive( p, p->vTokens );
        else if ( !strcmp( pDirective, ".default_output_load" ) )
            fStatus = Io_ReadBlifNetworkDefaultOutputLoad( p, p->vTokens );
        else if ( !strcmp( pDirective, ".and_gate_delay" ) )
            fStatus = Io_ReadBlifNetworkAndGateDelay( p, p->vTokens );
//        else if ( !strcmp( pDirective, ".subckt" ) )
//            fStatus = Io_ReadBlifNetworkSubcircuit( p, p->vTokens );
        else if ( !strcmp( pDirective, ".exdc" ) )
            break;
        else if ( !strcmp( pDirective, ".end" ) )
        {
            p->vTokens = Io_ReadBlifGetTokens(p);
            break;
        }
        else if ( !strcmp( pDirective, ".blackbox" ) )
        {
            pNtk->ntkType = ABC_NTK_NETLIST;
            pNtk->ntkFunc = ABC_FUNC_BLACKBOX;
            Mem_FlexStop( (Mem_Flex_t *)pNtk->pManFunc, 0 );
            pNtk->pManFunc = NULL;
        }
        else
            printf( "%s (line %d): Skipping directive \"%s\".\n", p->pFileName, 
                Extra_FileReaderGetLineNumber(p->pReader, 0), pDirective );
        if ( p->vTokens == NULL ) // some files do not have ".end" in the end
            break;
        if ( fStatus == 1 )
        {
            Extra_ProgressBarStop( pProgress );
            Abc_NtkDelete( pNtk );
            return NULL;
        }
    }
    if ( p->pNtkMaster == NULL )
        Extra_ProgressBarStop( pProgress );
    return pNtk;
}